

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O3

void __thiscall
olc::TransformedView::DrawSprite
          (TransformedView *this,vf2d *pos,Sprite *sprite,vf2d *scale,uint8_t flip)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Pixel PVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vi2d vStart;
  float local_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  uVar1 = sprite->width;
  uVar2 = sprite->height;
  local_48 = (float)(int)uVar1;
  fStack_44 = (float)(int)uVar2;
  uStack_40 = 0;
  local_50 = (*scale).x * local_48;
  fStack_4c = (*scale).y * fStack_44;
  iVar4 = (*(this->super_PGEX)._vptr_PGEX[10])();
  if ((char)iVar4 != '\0') {
    fVar11 = (this->m_vRecipPixel).x * local_48 * (this->m_vWorldScale).x * scale->x;
    local_48 = fStack_44 * (this->m_vRecipPixel).y * (this->m_vWorldScale).y * scale->y;
    uStack_40 = CONCAT44(fStack_44,fStack_44);
    (*(this->super_PGEX)._vptr_PGEX[5])(&local_50,this,pos);
    fVar12 = (float)(int)fStack_4c + local_48;
    if ((int)fStack_4c < (int)fVar12) {
      fVar9 = (float)(int)((float)(int)local_50 + fVar11);
      _local_48 = CONCAT44(fStack_44,1.0 / local_48);
      fVar8 = fStack_4c;
      do {
        fVar10 = local_50;
        if ((int)local_50 < (int)fVar9) {
          do {
            plVar3 = PGEX::pge;
            iVar5 = (int)((float)sprite->width *
                         (float)((int)fVar10 - (int)local_50) * (1.0 / fVar11));
            iVar4 = sprite->width + -1;
            if (iVar5 <= iVar4) {
              iVar4 = iVar5;
            }
            iVar6 = (int)((float)sprite->height * (float)((int)fVar8 - (int)fStack_4c) * local_48);
            iVar5 = sprite->height + -1;
            if (iVar6 <= iVar5) {
              iVar5 = iVar6;
            }
            PVar7 = Sprite::GetPixel(sprite,iVar4,iVar5);
            (**(code **)(*plVar3 + 0x28))(plVar3,fVar10,fVar8,PVar7.field_0);
            fVar10 = (float)((int)fVar10 + 1);
          } while (fVar9 != fVar10);
        }
        fVar8 = (float)((int)fVar8 + 1);
      } while (fVar8 != (float)(int)fVar12);
    }
  }
  return;
}

Assistant:

void TransformedView::DrawSprite(const olc::vf2d & pos, olc::Sprite * sprite, const olc::vf2d & scale, uint8_t flip)
	{
		olc::vf2d vSpriteSize = olc::vf2d(float(sprite->width), float(sprite->height));
		if (IsRectVisible(pos, vSpriteSize * scale))
		{
			olc::vf2d vSpriteScaledSize = vSpriteSize * m_vRecipPixel * m_vWorldScale * scale;
			olc::vi2d vPixel, vStart = WorldToScreen(pos), vEnd = vSpriteScaledSize + vStart;
			olc::vf2d vPixelStep = 1.0f / vSpriteScaledSize;
			for (vPixel.y = vStart.y; vPixel.y < vEnd.y; vPixel.y++)
			{
				for (vPixel.x = vStart.x; vPixel.x < vEnd.x; vPixel.x++)
				{
					olc::vf2d vSample = olc::vf2d(vPixel - vStart) * vPixelStep;
					pge->Draw(vPixel, sprite->Sample(vSample.x, vSample.y));
				}
			}
		}
	}